

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O2

void __thiscall CLI::App::_process_config_file(App *this)

{
  bool bVar1;
  bool bVar2;
  FileError *this_00;
  Option *pOVar3;
  iterator __begin2;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  allocator<char> local_99;
  pointer local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  config_files;
  string local_70;
  string local_50;
  
  pOVar3 = this->config_ptr_;
  if (pOVar3 != (Option *)0x0) {
    bVar1 = (pOVar3->super_OptionBase<CLI::Option>).required_;
    local_98 = (pOVar3->results_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = (pOVar3->results_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar5 = local_98 != pbVar4;
    if ((!bVar5) && ((pOVar3->envname_)._M_string_length != 0)) {
      detail::get_environment_value((string *)&config_files,&pOVar3->envname_);
      if (config_files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        pOVar3 = this->config_ptr_;
        ::std::__cxx11::string::string((string *)&local_70,(string *)&config_files);
        Option::add_result(pOVar3,&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
      }
      ::std::__cxx11::string::~string((string *)&config_files);
      pOVar3 = this->config_ptr_;
    }
    Option::run_callback(pOVar3);
    Option::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&config_files,this->config_ptr_);
    if ((config_files.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         config_files.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((config_files.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0)) {
      if (bVar1 != false) {
        this_00 = (FileError *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"config file is required but none was given",&local_99);
        FileError::FileError(this_00,&local_50);
        __cxa_throw(this_00,&FileError::typeinfo,Error::~Error);
      }
    }
    else {
      bVar6 = local_98 != pbVar4;
      for (pbVar4 = config_files.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar4 != config_files.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pbVar4 = (pointer)((string *)pbVar4 + 1)) {
        bVar2 = _process_config_file(this,(string *)pbVar4,(bool)(bVar6 | bVar1));
        bVar5 = (bool)(bVar5 | bVar2);
      }
      if (bVar5 == false) {
        Option::clear(this->config_ptr_);
        pOVar3 = this->config_ptr_;
        bVar1 = pOVar3->force_callback_;
        pOVar3->force_callback_ = false;
        Option::run_callback(pOVar3);
        this->config_ptr_->force_callback_ = bVar1;
      }
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&config_files);
  }
  return;
}

Assistant:

CLI11_INLINE void App::_process_config_file() {
    if(config_ptr_ != nullptr) {
        bool config_required = config_ptr_->get_required();
        auto file_given = config_ptr_->count() > 0;
        if(!(file_given || config_ptr_->envname_.empty())) {
            std::string ename_string = detail::get_environment_value(config_ptr_->envname_);
            if(!ename_string.empty()) {
                config_ptr_->add_result(ename_string);
            }
        }
        config_ptr_->run_callback();

        auto config_files = config_ptr_->as<std::vector<std::string>>();
        bool files_used{file_given};
        if(config_files.empty() || config_files.front().empty()) {
            if(config_required) {
                throw FileError("config file is required but none was given");
            }
            return;
        }
        for(const auto &config_file : config_files) {
            if(_process_config_file(config_file, config_required || file_given)) {
                files_used = true;
            }
        }
        if(!files_used) {
            // this is done so the count shows as 0 if no callbacks were processed
            config_ptr_->clear();
            bool force = config_ptr_->force_callback_;
            config_ptr_->force_callback_ = false;
            config_ptr_->run_callback();
            config_ptr_->force_callback_ = force;
        }
    }
}